

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O2

void __thiscall Pl_LZWDecoder::addToTable(Pl_LZWDecoder *this,uchar c)

{
  uint uVar1;
  reference this_00;
  uchar *__src;
  uchar *__dest;
  runtime_error *prVar2;
  uchar tmp [1];
  Buffer entry;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = this->last_code;
  if (uVar1 < 0x100) {
    __src = tmp;
    tmp[0] = (uchar)uVar1;
    uVar1 = 1;
  }
  else {
    if (uVar1 < 0x102) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_70,this->last_code);
      std::operator+(&local_50,"Pl_LZWDecoder::addToTable called with invalid code (",&local_70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entry,
                     &local_50,")");
      std::runtime_error::runtime_error(prVar2,(string *)&entry);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((ulong)((long)(this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->table).super__Vector_base<Buffer,_std::allocator<Buffer>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)(uVar1 - 0x102)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Pl_LZWDecoder::addToTable: table overflow");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = std::vector<Buffer,_std::allocator<Buffer>_>::at(&this->table,(ulong)(uVar1 - 0x102));
    __src = Buffer::getBuffer(this_00);
    entry.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
    super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
    super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
         (unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
         Buffer::getSize(this_00);
    uVar1 = QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::convert
                      ((unsigned_long *)&entry);
  }
  Buffer::Buffer(&entry,(ulong)(uVar1 + 1));
  __dest = Buffer::getBuffer(&entry);
  memcpy(__dest,__src,(ulong)uVar1);
  __dest[uVar1] = c;
  std::vector<Buffer,_std::allocator<Buffer>_>::emplace_back<Buffer>(&this->table,&entry);
  Buffer::~Buffer(&entry);
  return;
}

Assistant:

void
Pl_LZWDecoder::addToTable(unsigned char c)
{
    unsigned int last_size = 0;
    unsigned char const* last_data = nullptr;
    unsigned char tmp[1];

    if (this->last_code < 256) {
        tmp[0] = static_cast<unsigned char>(this->last_code);
        last_data = tmp;
        last_size = 1;
    } else if (this->last_code > 257) {
        unsigned int idx = this->last_code - 258;
        if (idx >= table.size()) {
            throw std::runtime_error("Pl_LZWDecoder::addToTable: table overflow");
        }
        Buffer& b = table.at(idx);
        last_data = b.getBuffer();
        last_size = QIntC::to_uint(b.getSize());
    } else {
        throw std::runtime_error(
            "Pl_LZWDecoder::addToTable called with invalid code (" +
            std::to_string(this->last_code) + ")");
    }

    Buffer entry(1 + last_size);
    unsigned char* new_data = entry.getBuffer();
    memcpy(new_data, last_data, last_size);
    new_data[last_size] = c;
    this->table.push_back(std::move(entry));
}